

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmark.cpp
# Opt level: O0

void __thiscall
QBenchmarkTestMethodData::setResults
          (QBenchmarkTestMethodData *this,QList<QBenchmarkMeasurerBase::Measurement> *list,
          bool setByMacro)

{
  bool bVar1;
  int iVar2;
  Measurement *pMVar3;
  const_iterator o;
  Measurement *pMVar4;
  byte in_DL;
  Measurement *in_RSI;
  QBenchmarkContext *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  QList<QBenchmarkMeasurerBase::Measurement> *__range1;
  bool accepted;
  Measurement m;
  const_iterator __end1;
  const_iterator __begin1;
  Measurement firstMeasurement;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar5;
  QBenchmarkContext *args;
  const_iterator in_stack_ffffffffffffffc8;
  double local_20;
  ulong local_18;
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = in_DL & 1;
  args = in_RDI;
  memset(&local_20,0,0x10);
  bVar1 = QList<QBenchmarkMeasurerBase::Measurement>::isEmpty
                    ((QList<QBenchmarkMeasurerBase::Measurement> *)0x11f1d8);
  if (!bVar1) {
    pMVar3 = QList<QBenchmarkMeasurerBase::Measurement>::constFirst
                       ((QList<QBenchmarkMeasurerBase::Measurement> *)in_RDI);
    local_20 = pMVar3->value;
    local_18 = *(ulong *)&pMVar3->metric;
  }
  if (QBenchmarkGlobalData::current->iterationCount == -1) {
    if (((current->runOnce & 1U) == 0) && ((local_9 & 1) != 0)) {
      if (QBenchmarkGlobalData::current->walltimeMinimum == -1) {
        iVar2 = (*QBenchmarkGlobalData::current->measurer->_vptr_QBenchmarkMeasurerBase[4])
                          (local_20,QBenchmarkGlobalData::current->measurer,local_18 & 0xffffffff);
        uVar5 = (byte)iVar2 & 1;
      }
      else {
        uVar5 = (double)QBenchmarkGlobalData::current->walltimeMinimum < local_20;
      }
    }
    else {
      *(undefined4 *)((long)&(in_RDI->tag).d.d + 4) = 1;
      uVar5 = true;
    }
  }
  else {
    uVar5 = true;
  }
  if ((bool)uVar5 == false) {
    *(int *)((long)&(in_RDI->tag).d.d + 4) = *(int *)((long)&(in_RDI->tag).d.d + 4) << 1;
  }
  else {
    *(undefined1 *)((long)&(in_RDI->tag).d.d + 1) = 1;
  }
  *(undefined1 *)&(in_RDI->tag).d.d = 1;
  QList<QBenchmarkMeasurerBase::Measurement>::size
            ((QList<QBenchmarkMeasurerBase::Measurement> *)in_RSI);
  QList<QBenchmarkResult>::reserve
            ((QList<QBenchmarkResult> *)in_stack_ffffffffffffffc8.i,in_stack_00000008);
  pMVar3 = in_RSI;
  QList<QBenchmarkMeasurerBase::Measurement>::begin
            ((QList<QBenchmarkMeasurerBase::Measurement> *)in_RDI);
  o = QList<QBenchmarkMeasurerBase::Measurement>::end
                ((QList<QBenchmarkMeasurerBase::Measurement> *)in_RDI);
  while (bVar1 = QList<QBenchmarkMeasurerBase::Measurement>::const_iterator::operator!=
                           ((const_iterator *)&stack0xffffffffffffffc8,o), bVar1) {
    pMVar4 = QList<QBenchmarkMeasurerBase::Measurement>::const_iterator::operator*
                       ((const_iterator *)&stack0xffffffffffffffc8);
    QList<QBenchmarkResult>::
    emplaceBack<QBenchmarkContext&,QBenchmarkMeasurerBase::Measurement&,int&,bool&>
              ((QList<QBenchmarkResult> *)pMVar4->value,args,pMVar3,
               (int *)CONCAT17(uVar5,in_stack_ffffffffffffff90),(bool *)in_RSI);
    QList<QBenchmarkMeasurerBase::Measurement>::const_iterator::operator++
              ((const_iterator *)&stack0xffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBenchmarkTestMethodData::setResults(const QList<QBenchmarkMeasurerBase::Measurement> &list,
                                          bool setByMacro)
{
    bool accepted = false;
    QBenchmarkMeasurerBase::Measurement firstMeasurement = {};
    if (!list.isEmpty())
        firstMeasurement = list.constFirst();

    // Always accept the result if the iteration count has been
    // specified on the command line with -iterations.
    if (QBenchmarkGlobalData::current->iterationCount != -1)
        accepted = true;

    else if (QBenchmarkTestMethodData::current->runOnce || !setByMacro) {
        iterationCount = 1;
        accepted = true;
    }

    // Test the result directly without calling the measurer if the minimum time
    // has been specified on the command line with -minimumvalue.
    else if (QBenchmarkGlobalData::current->walltimeMinimum != -1)
        accepted = (firstMeasurement.value > QBenchmarkGlobalData::current->walltimeMinimum);
    else
        accepted = QBenchmarkGlobalData::current->measurer->isMeasurementAccepted(firstMeasurement);

    // Accept the result or double the number of iterations.
    if (accepted)
        resultAccepted = true;
    else
        iterationCount *= 2;

    valid = true;
    results.reserve(list.size());
    for (auto m : list)
        results.emplaceBack(QBenchmarkGlobalData::current->context, m, iterationCount, setByMacro);
}